

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert_A1R5G5B5toB8G8R8(void *sP,s32 sN,void *dP)

{
  s32 x;
  u8 *dB;
  u16 *sB;
  void *dP_local;
  s32 sN_local;
  void *sP_local;
  
  dB = (u8 *)dP;
  sB = (u16 *)sP;
  for (x = 0; x < sN; x = x + 1) {
    *dB = (u8)((int)(*sB & 0x7c00) >> 7);
    dB[1] = (u8)((int)(*sB & 0x3e0) >> 2);
    dB[2] = (u8)((*sB & 0x1f) << 3);
    sB = sB + 1;
    dB = dB + 3;
  }
  return;
}

Assistant:

void CColorConverter::convert_A1R5G5B5toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u16 *sB = (u16 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[0] = (*sB & 0x7c00) >> 7;
		dB[1] = (*sB & 0x03e0) >> 2;
		dB[2] = (*sB & 0x1f) << 3;

		sB += 1;
		dB += 3;
	}
}